

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O3

void __thiscall ThreadContext::InvalidateAllProtoInlineCaches(ThreadContext *this)

{
  int iVar1;
  Type pSVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  
  uVar3 = (this->protoInlineCacheByPropId).bucketCount;
  if (uVar3 != 0) {
    uVar5 = 0;
    do {
      iVar4 = (this->protoInlineCacheByPropId).buckets[uVar5];
      if (iVar4 != -1) {
        do {
          pSVar2 = (this->protoInlineCacheByPropId).entries;
          iVar1 = pSVar2[iVar4].
                  super_DefaultHashedEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .
                  super_KeyValueEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
                  .
                  super_ValueEntry<SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>_>
                  .
                  super_KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
                  .next;
          InvalidateAndDeleteInlineCacheList
                    (this,pSVar2[iVar4].
                          super_DefaultHashedEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                          .
                          super_KeyValueEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
                          .
                          super_ValueEntry<SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>_>
                          .
                          super_KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
                          .value);
          iVar4 = iVar1;
        } while (iVar1 != -1);
        uVar3 = (this->protoInlineCacheByPropId).bucketCount;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar3);
  }
  JsUtil::
  BaseDictionary<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Reset(&this->protoInlineCacheByPropId);
  return;
}

Assistant:

void
ThreadContext::InvalidateAllProtoInlineCaches()
{
    protoInlineCacheByPropId.Map([this](Js::PropertyId propertyId, InlineCacheList* inlineCacheList)
    {
        InvalidateAndDeleteInlineCacheList(inlineCacheList);
    });
    protoInlineCacheByPropId.Reset();
}